

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jddctmgr.c
# Opt level: O0

void jinit_inverse_dct(j_decompress_ptr cinfo)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long in_RDI;
  jpeg_component_info *compptr;
  int ci;
  my_idct_ptr idct;
  long local_20;
  int local_14;
  
  puVar1 = (undefined8 *)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x80);
  *(undefined8 **)(in_RDI + 600) = puVar1;
  *puVar1 = start_pass;
  local_14 = 0;
  local_20 = *(long *)(in_RDI + 0x130);
  for (; local_14 < *(int *)(in_RDI + 0x38); local_14 = local_14 + 1) {
    uVar2 = (*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x100);
    *(undefined8 *)(local_20 + 0x58) = uVar2;
    memset(*(void **)(local_20 + 0x58),0,0x100);
    *(undefined4 *)((long)puVar1 + (long)local_14 * 4 + 0x58) = 0xffffffff;
    local_20 = local_20 + 0x60;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_inverse_dct(j_decompress_ptr cinfo)
{
  my_idct_ptr idct;
  int ci;
  jpeg_component_info *compptr;

  idct = (my_idct_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_idct_controller));
  cinfo->idct = (struct jpeg_inverse_dct *)idct;
  idct->pub.start_pass = start_pass;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Allocate and pre-zero a multiplier table for each component */
    compptr->dct_table =
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  sizeof(multiplier_table));
    MEMZERO(compptr->dct_table, sizeof(multiplier_table));
    /* Mark multiplier table not yet set up for any method */
    idct->cur_method[ci] = -1;
  }
}